

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.h
# Opt level: O0

VariableIndex __thiscall
cnn::ComputationGraph::add_function<cnn::PickRange,unsigned_int&,unsigned_int&>
          (ComputationGraph *this,initializer_list<cnn::VariableIndex> *arguments,
          uint *side_information,uint *side_information_1)

{
  size_type sVar1;
  PickRange *in_RSI;
  vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *in_RDI;
  VariableIndex *in_stack_00000038;
  ComputationGraph *in_stack_00000040;
  VariableIndex *new_node_index;
  value_type *in_stack_ffffffffffffff88;
  uint uVar2;
  vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *this_00;
  PickRange *this_01;
  uint local_2c [11];
  
  this_00 = in_RDI;
  this_01 = in_RSI;
  sVar1 = std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::size
                    ((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)in_RSI);
  local_2c[0] = (uint)sVar1;
  VariableIndex::VariableIndex((VariableIndex *)in_RDI,local_2c);
  operator_new(0x58);
  PickRange::PickRange
            (this_01,(initializer_list<cnn::VariableIndex> *)in_RSI,(uint)((ulong)this_00 >> 0x20),
             (uint)this_00);
  std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::push_back
            (this_00,in_stack_ffffffffffffff88);
  uVar2 = (uint)this_00;
  set_dim_for_new_node(in_stack_00000040,in_stack_00000038);
  return (VariableIndex)uVar2;
}

Assistant:

inline VariableIndex ComputationGraph::add_function(const std::initializer_list<VariableIndex>& arguments,
                                              Args&&... side_information) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new Function(arguments, std::forward<Args>(side_information)...));
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}